

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

string * __thiscall
VECTOR_HORI_VERT::Vector::get_filename_abi_cxx11_(string *__return_storage_ptr__,Vector *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->filename_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Vector::get_filename() const {
    return filename_;
  }